

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O2

bool __thiscall spvtools::utils::BitVector::Get(BitVector *this,uint32_t i)

{
  pointer puVar1;
  
  puVar1 = (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(i >> 6) <
      (ulong)((long)(this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return (puVar1[i >> 6] >> ((ulong)i & 0x3f) & 1) != 0;
  }
  return false;
}

Assistant:

bool Get(uint32_t i) const {
    uint32_t element_index = i / kBitContainerSize;
    uint32_t bit_in_element = i % kBitContainerSize;

    if (element_index >= bits_.size()) {
      return false;
    }

    return (bits_[element_index] &
            (static_cast<BitContainer>(1) << bit_in_element)) != 0;
  }